

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# temporal_filter.c
# Opt level: O2

double av1_estimate_noise_from_single_plane_c
                 (uint8_t *src,int height,int width,int stride,int edge_thresh)

{
  uint uVar1;
  int iVar2;
  int iVar3;
  uint uVar4;
  int iVar5;
  int *piVar6;
  int iVar7;
  long lVar8;
  long lVar9;
  long lVar10;
  int j;
  int iVar11;
  long lVar12;
  double dVar13;
  int local_84;
  long local_70;
  int local_68;
  int local_64;
  int local_60;
  int local_5c;
  int local_58;
  int local_54;
  int local_50;
  int local_4c;
  int local_48;
  int mat [3] [3];
  
  lVar12 = 0;
  local_84 = 0;
  local_70 = 0;
  for (iVar5 = 1; iVar5 < height + -1; iVar5 = iVar5 + 1) {
    mat[0]._0_8_ = lVar12;
    for (iVar11 = 1; iVar11 < width + -1; iVar11 = iVar11 + 1) {
      piVar6 = &local_68;
      lVar9 = -1;
      lVar8 = lVar12;
      while (lVar9 != 2) {
        lVar9 = lVar9 + 1;
        for (lVar10 = 0; lVar10 != 3; lVar10 = lVar10 + 1) {
          piVar6[lVar10] = (uint)src[(int)lVar8 + (int)lVar10];
        }
        lVar8 = lVar8 + (ulong)(uint)stride;
        piVar6 = piVar6 + 3;
      }
      iVar7 = (((local_68 + local_50) - local_60) - local_48) + (local_5c - local_54) * 2;
      iVar2 = (((local_60 + local_68) - local_50) - local_48) + (local_64 - local_4c) * 2;
      iVar3 = -iVar7;
      if (0 < iVar7) {
        iVar3 = iVar7;
      }
      iVar7 = -iVar2;
      if (0 < iVar2) {
        iVar7 = iVar2;
      }
      if (iVar7 + iVar3 < edge_thresh) {
        uVar1 = local_60 + local_68 + local_50 + local_48 +
                (local_64 + local_4c + local_54 + local_5c) * -2 + local_58 * 4;
        uVar4 = -uVar1;
        if (0 < (int)uVar1) {
          uVar4 = uVar1;
        }
        local_70 = local_70 + (ulong)uVar4;
        local_84 = local_84 + 1;
      }
      lVar12 = lVar12 + 1;
    }
    lVar12 = mat[0]._0_8_ + (ulong)(uint)stride;
  }
  if (local_84 < 0x10) {
    dVar13 = -1.0;
  }
  else {
    dVar13 = ((double)local_70 / (double)(local_84 * 6)) * 1.25331413732;
  }
  return dVar13;
}

Assistant:

double av1_estimate_noise_from_single_plane_c(const uint8_t *src, int height,
                                              int width, int stride,
                                              int edge_thresh) {
  int64_t accum = 0;
  int count = 0;

  for (int i = 1; i < height - 1; ++i) {
    for (int j = 1; j < width - 1; ++j) {
      // Setup a small 3x3 matrix.
      const int center_idx = i * stride + j;
      int mat[3][3];
      for (int ii = -1; ii <= 1; ++ii) {
        for (int jj = -1; jj <= 1; ++jj) {
          const int idx = center_idx + ii * stride + jj;
          mat[ii + 1][jj + 1] = src[idx];
        }
      }
      // Compute sobel gradients.
      const int Gx = (mat[0][0] - mat[0][2]) + (mat[2][0] - mat[2][2]) +
                     2 * (mat[1][0] - mat[1][2]);
      const int Gy = (mat[0][0] - mat[2][0]) + (mat[0][2] - mat[2][2]) +
                     2 * (mat[0][1] - mat[2][1]);
      const int Ga = ROUND_POWER_OF_TWO(abs(Gx) + abs(Gy), 0);
      // Accumulate Laplacian.
      if (Ga < edge_thresh) {  // Only count smooth pixels.
        const int v = 4 * mat[1][1] -
                      2 * (mat[0][1] + mat[2][1] + mat[1][0] + mat[1][2]) +
                      (mat[0][0] + mat[0][2] + mat[2][0] + mat[2][2]);
        accum += ROUND_POWER_OF_TWO(abs(v), 0);
        ++count;
      }
    }
  }

  // Return -1.0 (unreliable estimation) if there are too few smooth pixels.
  return (count < 16) ? -1.0 : (double)accum / (6 * count) * SQRT_PI_BY_2;
}